

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packRows(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  U *pUVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  Dring *pDVar11;
  int *piVar12;
  long lVar13;
  cpp_dec_float<100U,_int,_void> *this_00;
  cpp_dec_float<100U,_int,_void> *v;
  
  pUVar1 = &this->u;
  pnVar4 = (this->u).row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->u).row.idx;
  piVar6 = (this->u).row.len;
  piVar8 = (this->u).row.max;
  piVar7 = (this->u).row.start;
  iVar10 = 0;
  pDVar11 = (Dring *)pUVar1;
  while (pDVar11 = (((Row *)&pDVar11->next)->list).next, (U *)pDVar11 != pUVar1) {
    iVar2 = pDVar11->idx;
    if (piVar7[iVar2] != iVar10) goto LAB_0031408b;
    iVar3 = piVar6[iVar2];
    iVar10 = iVar10 + iVar3;
    piVar8[iVar2] = iVar3;
  }
LAB_00314126:
  piVar8[this->thedim] = 0;
  (this->u).row.used = iVar10;
  return;
LAB_0031408b:
  do {
    iVar2 = pDVar11->idx;
    lVar9 = (long)piVar7[iVar2];
    piVar7[iVar2] = iVar10;
    iVar3 = piVar6[iVar2];
    piVar8[iVar2] = iVar3;
    lVar13 = iVar3 + lVar9;
    piVar12 = piVar5 + iVar10;
    this_00 = &pnVar4[iVar10].m_backend;
    v = &pnVar4[lVar9].m_backend;
    for (; lVar9 < lVar13; lVar9 = lVar9 + 1) {
      *piVar12 = piVar5[lVar9];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,v);
      iVar10 = iVar10 + 1;
      piVar12 = piVar12 + 1;
      this_00 = this_00 + 1;
      v = v + 1;
    }
    pDVar11 = pDVar11->next;
  } while ((U *)pDVar11 != pUVar1);
  piVar8 = (this->u).row.max;
  goto LAB_00314126;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}